

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O0

bool __thiscall QtMWidgets::ProgressBarPrivate::repaintRequired(ProgressBarPrivate *this)

{
  int local_54;
  QRect local_44;
  QRect local_34;
  int local_20;
  int grooveBlock;
  ProgressBarPrivate *pPStack_18;
  int valueDifference;
  ProgressBarPrivate *this_local;
  
  if (this->value == this->lastPaintedValue) {
    this_local._7_1_ = false;
  }
  else {
    local_20 = this->value - this->lastPaintedValue;
    pPStack_18 = this;
    grooveBlock = qAbs<int>(&local_20);
    if (this->orientation == Horizontal) {
      local_34 = grooveRect(this);
      local_54 = QRect::width(&local_34);
    }
    else {
      local_44 = grooveRect(this);
      local_54 = QRect::height(&local_44);
    }
    this_local._7_1_ = this->maximum - this->minimum < grooveBlock * local_54;
  }
  return this_local._7_1_;
}

Assistant:

bool
ProgressBarPrivate::repaintRequired() const
{
	if( value == lastPaintedValue )
		return false;

	const int valueDifference = qAbs( value - lastPaintedValue );

	const int grooveBlock = ( orientation == Qt::Horizontal ? grooveRect().width() :
		grooveRect().height() );

	// This expression is basically
	// ( valueDifference / 1 > ( maximum - minimum ) / grooveBlock )
	// transformed to avoid integer division.
	return ( valueDifference * grooveBlock > ( maximum - minimum ) );
}